

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O1

void __thiscall
dlib::timer<dlib::text_grid>::timer(timer<dlib::text_grid> *this,text_grid *ao_,af_type af_)

{
  undefined8 in_RCX;
  
  threaded_object::threaded_object((threaded_object *)this);
  (this->super_timer_base).super_threaded_object._vptr_threaded_object =
       (_func_int **)&PTR__timer_003229d0;
  this->ao = ao_;
  this->af = af_;
  *(undefined8 *)&this->field_0xa8 = in_RCX;
  get_global_clock();
  (this->super_timer_base).delay = 1000;
  (this->super_timer_base).next_time_to_run = 0;
  (this->super_timer_base).running = false;
  (this->super_timer_base).in_global_clock = false;
  return;
}

Assistant:

timer<T>::
    timer(  
        T& ao_,
        af_type af_
    ) : 
        ao(ao_),
        af(af_),
        gc(get_global_clock())
    {
        delay = 1000;
        next_time_to_run = 0;
        running = false;
        in_global_clock = false;
    }